

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O3

void __thiscall MipsGenerator::TranslateADD(MipsGenerator *this,Pcode *item)

{
  _Base_ptr *pp_Var1;
  long *plVar2;
  pointer pcVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long *plVar10;
  undefined8 *puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  uint uVar13;
  pointer pPVar14;
  long *plVar15;
  ulong uVar16;
  MipsGenerator *this_00;
  pointer pPVar17;
  uint __len;
  string num3;
  string num2;
  string num1;
  undefined1 local_190 [32];
  pointer local_170;
  pointer local_168;
  pointer local_160;
  _Alloc_hider _Stack_158;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  undefined1 local_f0 [32];
  _Base_ptr *local_d0;
  undefined8 local_c8;
  _Base_ptr local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar3 = (item->m_num1)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar3,pcVar3 + (item->m_num1)._M_string_length);
  local_f0._0_8_ = local_f0 + 0x10;
  pcVar3 = (item->m_num2)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar3,pcVar3 + (item->m_num2)._M_string_length);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  pcVar3 = (item->m_num3)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar3,pcVar3 + (item->m_num3)._M_string_length);
  plVar2 = (long *)(local_190 + 0x10);
  this_00 = (MipsGenerator *)local_190;
  local_190._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"$25","");
  iVar5 = PrepareStoreREG(this_00,&local_b0,&reg1_abi_cxx11_,(string *)local_190);
  if ((long *)local_190._0_8_ != plVar2) {
    operator_delete((void *)local_190._0_8_);
  }
  local_190._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"$26","");
  uVar6 = PrepareLoadREG(this,(string *)local_f0,&reg2_abi_cxx11_,(string *)local_190);
  if ((long *)local_190._0_8_ != plVar2) {
    operator_delete((void *)local_190._0_8_);
  }
  local_190._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"$27","");
  uVar7 = PrepareLoadREG(this,&local_110,&reg3_abi_cxx11_,(string *)local_190);
  if ((long *)local_190._0_8_ != plVar2) {
    operator_delete((void *)local_190._0_8_);
  }
  if ((uVar7 & uVar6) != 0xffffffff) {
    if (uVar6 == 0xffffffff) {
      std::operator+(&local_130,"addiu ",&reg1_abi_cxx11_);
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
      pPVar14 = (pointer)(puVar11 + 2);
      if ((pointer)*puVar11 == pPVar14) {
        local_160 = *(pointer *)pPVar14;
        _Stack_158._M_p = (pointer)puVar11[3];
        local_170 = (pointer)&local_160;
      }
      else {
        local_160 = *(pointer *)pPVar14;
        local_170 = (pointer)*puVar11;
      }
      local_168 = (pointer)puVar11[1];
      *puVar11 = pPVar14;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_170,(ulong)reg3_abi_cxx11_._M_dataplus._M_p);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 == paVar12) {
        local_140._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_140._8_8_ = puVar11[3];
        local_150._0_8_ = &local_140;
      }
      else {
        local_140._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_150._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_150._8_8_ = puVar11[1];
      *puVar11 = paVar12;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)std::__cxx11::string::append(local_150);
      plVar10 = puVar11 + 2;
      if ((long *)*puVar11 == plVar10) {
        local_190._16_8_ = *plVar10;
        local_190._24_8_ = puVar11[3];
        local_190._0_8_ = plVar2;
      }
      else {
        local_190._16_8_ = *plVar10;
        local_190._0_8_ = (long *)*puVar11;
      }
      local_190._8_8_ = puVar11[1];
      *puVar11 = plVar10;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append(local_190,local_f0._0_8_);
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_40 = *plVar15;
        uStack_38 = (undefined4)plVar10[3];
        uStack_34 = *(undefined4 *)((long)plVar10 + 0x1c);
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar15;
        local_50 = (long *)*plVar10;
      }
      local_48 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      fprintf((FILE *)this->m_fp_mips,"%s\n",local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if ((long *)local_190._0_8_ != plVar2) {
        operator_delete((void *)local_190._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._0_8_ != &local_140) {
        operator_delete((void *)local_150._0_8_);
      }
      if (local_170 != (pointer)&local_160) goto LAB_0015310e;
    }
    else if (uVar7 == 0xffffffff) {
      std::operator+(&local_130,"addiu ",&reg1_abi_cxx11_);
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
      pPVar14 = (pointer)(puVar11 + 2);
      if ((pointer)*puVar11 == pPVar14) {
        local_160 = *(pointer *)pPVar14;
        _Stack_158._M_p = (pointer)puVar11[3];
        local_170 = (pointer)&local_160;
      }
      else {
        local_160 = *(pointer *)pPVar14;
        local_170 = (pointer)*puVar11;
      }
      local_168 = (pointer)puVar11[1];
      *puVar11 = pPVar14;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_170,(ulong)reg2_abi_cxx11_._M_dataplus._M_p);
      local_150._0_8_ = &local_140;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 == paVar12) {
        local_140._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_140._8_8_ = puVar11[3];
      }
      else {
        local_140._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_150._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_150._8_8_ = puVar11[1];
      *puVar11 = paVar12;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)std::__cxx11::string::append(local_150);
      plVar10 = puVar11 + 2;
      if ((long *)*puVar11 == plVar10) {
        local_190._16_8_ = *plVar10;
        local_190._24_8_ = puVar11[3];
        local_190._0_8_ = plVar2;
      }
      else {
        local_190._16_8_ = *plVar10;
        local_190._0_8_ = (long *)*puVar11;
      }
      local_190._8_8_ = puVar11[1];
      *puVar11 = plVar10;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append(local_190,(ulong)local_110._M_dataplus._M_p)
      ;
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_60 = *plVar15;
        uStack_58 = (undefined4)plVar10[3];
        uStack_54 = *(undefined4 *)((long)plVar10 + 0x1c);
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar15;
        local_70 = (long *)*plVar10;
      }
      local_68 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      fprintf((FILE *)this->m_fp_mips,"%s\n",local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if ((long *)local_190._0_8_ != plVar2) {
        operator_delete((void *)local_190._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._0_8_ != &local_140) {
        operator_delete((void *)local_150._0_8_);
      }
      if (local_170 != (pointer)&local_160) goto LAB_0015310e;
    }
    else {
      std::operator+(&local_130,"addu ",&reg1_abi_cxx11_);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
      local_170 = (pointer)&local_160;
      pPVar14 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pPVar14) {
        local_160 = *(pointer *)pPVar14;
        _Stack_158._M_p = (pointer)plVar10[3];
      }
      else {
        local_160 = *(pointer *)pPVar14;
        local_170 = (pointer)*plVar10;
      }
      local_168 = (pointer)plVar10[1];
      *plVar10 = (long)pPVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_170,(ulong)reg2_abi_cxx11_._M_dataplus._M_p);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 == paVar12) {
        local_140._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_140._8_8_ = plVar10[3];
        local_150._0_8_ = &local_140;
      }
      else {
        local_140._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_150._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar10;
      }
      local_150._8_8_ = plVar10[1];
      *plVar10 = (long)paVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      puVar11 = (undefined8 *)std::__cxx11::string::append(local_150);
      plVar10 = puVar11 + 2;
      if ((long *)*puVar11 == plVar10) {
        local_190._16_8_ = *plVar10;
        local_190._24_8_ = puVar11[3];
        local_190._0_8_ = plVar2;
      }
      else {
        local_190._16_8_ = *plVar10;
        local_190._0_8_ = (long *)*puVar11;
      }
      local_190._8_8_ = puVar11[1];
      *puVar11 = plVar10;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  (local_190,(ulong)reg3_abi_cxx11_._M_dataplus._M_p);
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_80 = *plVar15;
        uStack_78 = (undefined4)plVar10[3];
        uStack_74 = *(undefined4 *)((long)plVar10 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar15;
        local_90 = (long *)*plVar10;
      }
      local_88 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      fprintf((FILE *)this->m_fp_mips,"%s\n",local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if ((long *)local_190._0_8_ != plVar2) {
        operator_delete((void *)local_190._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._0_8_ != &local_140) {
        operator_delete((void *)local_150._0_8_);
      }
      if (local_170 != (pointer)&local_160) {
LAB_0015310e:
        operator_delete(local_170);
      }
    }
    paVar12 = &local_130.field_2;
    goto LAB_001535ba;
  }
  iVar8 = atoi((char *)local_f0._0_8_);
  iVar9 = atoi(local_110._M_dataplus._M_p);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 "li ",&reg1_abi_cxx11_);
  plVar10 = (long *)std::__cxx11::string::append(local_150);
  uVar6 = iVar9 + iVar8;
  plVar15 = plVar10 + 2;
  if ((long *)*plVar10 == plVar15) {
    local_190._16_8_ = *plVar15;
    local_190._24_8_ = plVar10[3];
    local_190._0_8_ = plVar2;
  }
  else {
    local_190._16_8_ = *plVar15;
    local_190._0_8_ = (long *)*plVar10;
  }
  local_190._8_8_ = plVar10[1];
  *plVar10 = (long)plVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  uVar7 = -uVar6;
  if (0 < (int)uVar6) {
    uVar7 = uVar6;
  }
  __len = 1;
  if (9 < uVar7) {
    uVar16 = (ulong)uVar7;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar13 = (uint)uVar16;
      if (uVar13 < 100) {
        __len = __len - 2;
        goto LAB_00153470;
      }
      if (uVar13 < 1000) {
        __len = __len - 1;
        goto LAB_00153470;
      }
      if (uVar13 < 10000) goto LAB_00153470;
      uVar16 = uVar16 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar13);
    __len = __len + 1;
  }
LAB_00153470:
  local_170 = (pointer)&local_160;
  std::__cxx11::string::_M_construct((ulong)&local_170,(char)__len - (char)((int)uVar6 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)&local_170->m_op + (ulong)(uVar6 >> 0x1f)),__len,uVar7);
  pPVar14 = (pointer)((long)&local_168->m_op + local_190._8_8_);
  pPVar17 = (pointer)0xf;
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    pPVar17 = (pointer)local_190._16_8_;
  }
  if (pPVar17 < pPVar14) {
    pPVar17 = (pointer)0xf;
    if (local_170 != (pointer)&local_160) {
      pPVar17 = local_160;
    }
    if (pPVar17 < pPVar14) goto LAB_001534f6;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,local_190._0_8_);
  }
  else {
LAB_001534f6:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append(local_190,(ulong)local_170);
  }
  local_d0 = &local_c0;
  pp_Var1 = (_Base_ptr *)(puVar11 + 2);
  if ((_Base_ptr *)*puVar11 == pp_Var1) {
    local_c0 = *pp_Var1;
    uStack_b8 = *(undefined4 *)(puVar11 + 3);
    uStack_b4 = *(undefined4 *)((long)puVar11 + 0x1c);
  }
  else {
    local_c0 = *pp_Var1;
    local_d0 = (_Base_ptr *)*puVar11;
  }
  local_c8 = puVar11[1];
  *puVar11 = pp_Var1;
  puVar11[1] = 0;
  *(undefined1 *)pp_Var1 = 0;
  fprintf((FILE *)this->m_fp_mips,"%s\n",local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_170 != (pointer)&local_160) {
    operator_delete(local_170);
  }
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_);
  }
  paVar12 = &local_140;
LAB_001535ba:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar12->_M_allocated_capacity)[-2] != paVar12) {
    operator_delete((undefined1 *)(&paVar12->_M_allocated_capacity)[-2]);
  }
  if (iVar5 == 1) {
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"");
    local_150._0_8_ = &local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"t","");
    GenerateStore(this,&reg1_abi_cxx11_,&local_b0,(string *)local_190,(string *)local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._0_8_ != &local_140) {
      operator_delete((void *)local_150._0_8_);
    }
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((_Base_ptr)local_f0._0_8_ != (_Base_ptr)(local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MipsGenerator::TranslateADD(Pcode& item) {
    string num1 = item.GetNum1();
    string num2 = item.GetNum2();
    string num3 = item.GetNum3();
    int ret1 = PrepareStoreREG(num1, reg1, NUM1);
    int ret2 = PrepareLoadREG(num2, reg2, NUM2);
    int ret3 = PrepareLoadREG(num3, reg3, NUM3);
    if (ret2 == -1 && ret3 == -1) {
        int value = atoi(num2.c_str()) + atoi(num3.c_str());
        Output2File("li " + reg1 + " " + std::to_string(value));
    } else if (ret2 == -1) {
        Output2File("addiu " + reg1 + " " + reg3 + " " + num2);
    } else if (ret3 == -1) {
        Output2File("addiu " + reg1 + " " + reg2 + " " + num3);
    } else {
        Output2File("addu " + reg1 + " " + reg2 + " " + reg3);
    }
    if (ret1 == 1) {
        GenerateStore(reg1, num1, "", TMP);
    }
}